

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O2

bool __thiscall Nibbler::getUnsignedNumber(Nibbler *this,double *result)

{
  ulong uVar1;
  pointer pcVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  char *local_48 [4];
  
  uVar1 = this->_length;
  uVar4 = this->_cursor;
  if ((uVar1 <= uVar4) || (pcVar2 = (this->_input)._M_dataplus._M_p, 9 < (int)pcVar2[uVar4] - 0x30U)
     ) {
    return false;
  }
  uVar4 = uVar4 + 1;
  do {
    uVar5 = uVar4;
    uVar6 = uVar1;
    if (uVar1 <= uVar5) goto LAB_00109418;
    uVar4 = uVar5 + 1;
  } while ((int)pcVar2[uVar5] - 0x30U < 10);
  if (pcVar2[uVar5] == '.') {
    for (; uVar4 < uVar1; uVar4 = uVar4 + 1) {
      uVar5 = uVar4;
      if (9 < (int)pcVar2[uVar4] - 0x30U) goto LAB_001093b6;
    }
  }
  else {
LAB_001093b6:
    uVar6 = uVar5;
    if ((uVar5 < uVar1) && ((byte)(pcVar2[uVar5] | 0x20U) == 0x65)) {
      uVar4 = uVar5 + 1;
      if ((uVar4 < uVar1) && ((pcVar2[uVar4] == '-' || (pcVar2[uVar4] == '+')))) {
        uVar4 = uVar5 + 2;
      }
      if (uVar1 <= uVar4) {
        return false;
      }
      if (9 < (int)pcVar2[uVar4] - 0x30U) {
        return false;
      }
      do {
        uVar5 = uVar4 + 1;
        uVar6 = uVar1;
        if (uVar1 <= uVar5) break;
        lVar3 = uVar4 + 1;
        uVar4 = uVar5;
        uVar6 = uVar5;
      } while ((int)pcVar2[lVar3] - 0x30U < 10);
      std::__cxx11::string::substr((ulong)local_48,(ulong)this);
      fVar7 = strtof(local_48[0],(char **)0x0);
      *result = (double)fVar7;
      std::__cxx11::string::~string((string *)local_48);
      goto LAB_00109447;
    }
  }
LAB_00109418:
  std::__cxx11::string::substr((ulong)local_48,(ulong)this);
  fVar7 = strtof(local_48[0],(char **)0x0);
  *result = (double)fVar7;
  std::__cxx11::string::~string((string *)local_48);
LAB_00109447:
  this->_cursor = uVar6;
  return true;
}

Assistant:

bool Nibbler::getUnsignedNumber (double& result)
{
  std::string::size_type i = _cursor;

  // digit+
  if (i < _length && isdigit (_input[i]))
  {
    ++i;

    while (i < _length && isdigit (_input[i]))
      ++i;

    // ( . digit+ )?
    if (i < _length && _input[i] == '.')
    {
      ++i;

      while (i < _length && isdigit (_input[i]))
        ++i;
    }

    // ( [eE] [+-]? digit+ )?
    if (i < _length && (_input[i] == 'e' || _input[i] == 'E'))
    {
      ++i;

      if (i < _length && (_input[i] == '+' || _input[i] == '-'))
        ++i;

      if (i < _length && isdigit (_input[i]))
      {
        ++i;

        while (i < _length && isdigit (_input[i]))
          ++i;

        result = strtof (_input.substr (_cursor, i - _cursor).c_str (), NULL);
        _cursor = i;
        return true;
      }

      return false;
    }

    result = strtof (_input.substr (_cursor, i - _cursor).c_str (), NULL);
    _cursor = i;
    return true;
  }

  return false;
}